

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

void __thiscall
fmp4_stream::media_fragment::patch_tfdt(media_fragment *this,uint64_t patch,uint32_t seq_nr)

{
  uint64_t *puVar1;
  pointer puVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  allocator<char> local_101;
  undefined4 local_100;
  undefined1 local_fc;
  media_fragment *local_f8;
  uint32_t local_ec;
  long local_e8;
  pointer local_e0;
  uint local_d4;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((this->moof_box_).size_ != 0) {
    if (seq_nr != 0) {
      *(uint32_t *)&(this->mfhd_).super_full_box.field_0x6c = seq_nr;
    }
    puVar1 = &(this->tfdt_).base_media_decode_time_;
    *puVar1 = *puVar1 + patch;
    local_d4 = seq_nr >> 0x18 | (seq_nr & 0xff0000) >> 8 | (seq_nr & 0xff00) << 8 | seq_nr << 0x18;
    uVar7 = 8;
    local_f8 = this;
    local_ec = seq_nr;
    while( true ) {
      puVar2 = (local_f8->moof_box_).box_data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_f8->moof_box_).box_data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2) <= uVar7) break;
      local_e0 = puVar2 + uVar7;
      uVar5 = *(uint *)(puVar2 + uVar7);
      local_100 = *(undefined4 *)(puVar2 + uVar7 + 4);
      local_fc = 0;
      if (uVar5 == 0x1000000) {
        uVar6 = *(ulong *)(local_e0 + 8);
        uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
                uVar6 << 0x38;
        local_e8 = 8;
      }
      else {
        uVar6 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                       uVar5 << 0x18);
        local_e8 = 0;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"mfhd",&local_101);
      bVar4 = f_compare_4cc((char *)&local_100,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar4) {
        if (local_ec != 0) {
          *(uint *)(local_e0 + local_e8 + 0xc) = local_d4;
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"trun",&local_101);
        bVar4 = f_compare_4cc((char *)&local_100,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        if (!bVar4) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"tfdt",&local_101);
          bVar4 = f_compare_4cc((char *)&local_100,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          if (bVar4) {
            uVar3 = (local_f8->tfdt_).base_media_decode_time_;
            if ((local_f8->tfdt_).super_full_box.super_box.field_0x62 == '\0') {
              uVar5 = (uint)uVar3;
              *(uint *)(local_e0 + local_e8 + 0xc) =
                   uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
            }
            else {
              *(ulong *)(local_e0 + local_e8 + 0xc) =
                   uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                   (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                   (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                   | uVar3 << 0x38;
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b0,"tfhd",&local_101);
            bVar4 = f_compare_4cc((char *)&local_100,&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            if (!bVar4) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d0,"traf",&local_101);
              bVar4 = f_compare_4cc((char *)&local_100,&local_d0);
              std::__cxx11::string::~string((string *)&local_d0);
              uVar6 = uVar6 & 0xffffffff;
              if (bVar4) {
                uVar6 = 8;
              }
            }
          }
        }
      }
      uVar7 = uVar7 + uVar6;
    }
  }
  return;
}

Assistant:

void media_fragment::patch_tfdt(uint64_t patch, uint32_t seq_nr)
	{
		if (!moof_box_.size_)
			return;

		uint64_t box_size = 0;
		uint64_t offset = 8;

		if (seq_nr)
			this->mfhd_.seq_nr_ = seq_nr;

		this->tfdt_.base_media_decode_time_ = \
			this->tfdt_.base_media_decode_time_ + patch;

		// find the tfdt box and overwrite it
		while (moof_box_.box_data_.size() > offset)
		{
			unsigned int temp_off = 0;
			box_size = (uint64_t)fmp4_read_uint32((char *)&moof_box_.box_data_[offset]);
			uint8_t * ptr = &moof_box_.box_data_[0];
			char name[5] = { (char)ptr[offset + 4],(char)ptr[offset + 5],(char)ptr[offset + 6],(char)ptr[offset + 7],'\0' };

			if (box_size == 1) // the box_size is a large size (should not happen in fmp4)
			{
				temp_off = 8;
				box_size = fmp4_read_uint64((char *)& ptr[offset + temp_off]);
			}

			if (f_compare_4cc(name, "mfhd"))
			{
				
				if (seq_nr) 
					fmp4_write_uint32(seq_nr, (char *)&ptr[offset + temp_off + 12]);
				//mfhd_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				//cout << "mfhd size" << box_size << endl;
				continue;
			}

			if (f_compare_4cc(name, "trun"))
			{
				//trun_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				continue;
			}

			if (f_compare_4cc(name, "tfdt"))
			{
				
				this->tfdt_.version_ ? \
					fmp4_write_uint64(this->tfdt_.base_media_decode_time_, (char *)&ptr[offset + temp_off + 12]) : \
					fmp4_write_uint32((uint32_t)this->tfdt_.base_media_decode_time_, (char *)&ptr[offset + temp_off + 12]);

				offset += (uint64_t)box_size;
				continue;
			}

			if (f_compare_4cc(name, "tfhd"))
			{
				//tfhd_.parse((char *)& ptr[offset + temp_off]);
				offset += (uint64_t)box_size;
				continue;
			}

			// cmaf style only one traf box per moof so we skip it
			if (f_compare_4cc(name, "traf"))
			{
				offset += 8;
			}
			else
				offset += (unsigned int)box_size;
		}
	}